

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O3

void __thiscall features::truncate_to(features *this,size_t i)

{
  unsigned_long *puVar1;
  
  (this->values)._end = (this->values)._begin + i;
  puVar1 = (this->indicies)._begin;
  if ((this->indicies)._end != puVar1) {
    (this->indicies)._end = puVar1 + i;
  }
  if ((this->space_names)._begin != (this->space_names)._end) {
    free_space_names(this,i);
    (this->space_names)._end = (this->space_names)._begin + i;
  }
  return;
}

Assistant:

void truncate_to(size_t i)
  {
    values.end() = values.begin() + i;
    if (indicies.end() != indicies.begin())
      indicies.end() = indicies.begin() + i;
    if (space_names.begin() != space_names.end())
    {
      free_space_names(i);
      space_names.end() = space_names.begin() + i;
    }
  }